

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O3

void __thiscall QTextCursor::mergeCharFormat(QTextCursor *this,QTextCharFormat *modifier)

{
  int iVar1;
  QTextCursorPrivate *pQVar2;
  long in_FS_OFFSET;
  undefined1 local_38 [16];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->d).d.ptr;
  if (pQVar2 != (QTextCursorPrivate *)0x0) {
    if ((__atomic_base<int>)
        *(__int_type *)
         &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value != (__atomic_base<int>)0x1) {
      QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
      pQVar2 = (this->d).d.ptr;
    }
    if (pQVar2->priv != (QTextDocumentPrivate *)0x0) {
      if ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar2 = (this->d).d.ptr;
      }
      iVar1 = pQVar2->position;
      if ((__int_type)
          (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int> != 1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar2 = (this->d).d.ptr;
      }
      if (iVar1 != pQVar2->anchor) {
        if ((__int_type)
            (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value.super___atomic_base<int> != 1) {
          QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
          pQVar2 = (this->d).d.ptr;
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
          QTextCursorPrivate::setCharFormat(pQVar2,modifier,MergeFormat);
          return;
        }
        goto LAB_004bdace;
      }
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      charFormat((QTextCursor *)local_38);
      QTextFormat::merge((QTextFormat *)local_38,&modifier->super_QTextFormat);
      pQVar2 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar2 = (this->d).d.ptr;
      }
      iVar1 = QTextFormatCollection::indexForFormat(&pQVar2->priv->formats,(QTextFormat *)local_38);
      pQVar2 = (this->d).d.ptr;
      if ((__atomic_base<int>)
          *(__int_type *)
           &(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
            ._q_value != (__atomic_base<int>)0x1) {
        QSharedDataPointer<QTextCursorPrivate>::detach_helper(&this->d);
        pQVar2 = (this->d).d.ptr;
      }
      pQVar2->currentCharFormat = iVar1;
      QTextFormat::~QTextFormat((QTextFormat *)local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_004bdace:
  __stack_chk_fail();
}

Assistant:

void QTextCursor::mergeCharFormat(const QTextCharFormat &modifier)
{
    if (!d || !d->priv)
        return;
    if (d->position == d->anchor) {
        QTextCharFormat format = charFormat();
        format.merge(modifier);
        d->currentCharFormat = d->priv->formatCollection()->indexForFormat(format);
        return;
    }

    d->setCharFormat(modifier, QTextDocumentPrivate::MergeFormat);
}